

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O1

CURLcode cw_chunked_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t blen)

{
  undefined1 *puVar1;
  void *pvVar2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  char *pcVar5;
  size_t consumed;
  size_t local_30;
  
  if ((type & 1U) != 0) {
    pvVar2 = writer->ctx;
    local_30 = 0;
    CVar4 = httpchunk_readwrite(data,(Curl_chunker *)((long)pvVar2 + 0x20),writer->next,buf,blen,
                                &local_30);
    if (CVar4 == CURLE_OK) {
      if (*(int *)((long)pvVar2 + 0x28) == 8) {
        puVar1 = &(data->req).field_0xd9;
        *puVar1 = *puVar1 | 8;
        CVar4 = CURLE_OK;
        if (((data != (Curl_easy *)0x0 && blen != local_30) &&
            (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          CVar4 = CURLE_OK;
          Curl_infof(data,"Leftovers after chunking: %zu bytes",blen - local_30);
        }
      }
      else {
        CVar4 = CURLE_OK;
        if (((char)type < '\0') && (((data->req).field_0xdb & 2) == 0)) {
          Curl_failf(data,"transfer closed with outstanding read data remaining");
          CVar4 = CURLE_PARTIAL_FILE;
        }
      }
    }
    else {
      switch(*(undefined4 *)((long)pvVar2 + 0x2c)) {
      case 1:
        pcVar5 = "Too long hexadecimal number";
        break;
      case 2:
        pcVar5 = "Illegal or missing hexadecimal sequence";
        break;
      case 3:
        pcVar5 = "Malformed encoding found";
        break;
      case 4:
        pcVar5 = "Bad content-encoding found";
        break;
      case 5:
        pcVar5 = "Out of memory";
        break;
      case 6:
        Curl_failf(data,"Failed reading the chunked-encoded stream");
        return CVar4;
      default:
        pcVar5 = "OK";
      }
      Curl_failf(data,"%s in chunked-encoding",pcVar5);
    }
    return CVar4;
  }
  CVar4 = Curl_cwriter_write(data,writer->next,type,buf,blen);
  return CVar4;
}

Assistant:

static CURLcode cw_chunked_write(struct Curl_easy *data,
                                 struct Curl_cwriter *writer, int type,
                                 const char *buf, size_t blen)
{
  struct chunked_writer *ctx = writer->ctx;
  CURLcode result;
  size_t consumed;

  if(!(type & CLIENTWRITE_BODY))
    return Curl_cwriter_write(data, writer->next, type, buf, blen);

  consumed = 0;
  result = httpchunk_readwrite(data, &ctx->ch, writer->next, buf, blen,
                               &consumed);

  if(result) {
    if(CHUNKE_PASSTHRU_ERROR == ctx->ch.last_code) {
      failf(data, "Failed reading the chunked-encoded stream");
    }
    else {
      failf(data, "%s in chunked-encoding",
            Curl_chunked_strerror(ctx->ch.last_code));
    }
    return result;
  }

  blen -= consumed;
  if(CHUNK_DONE == ctx->ch.state) {
    /* chunks read successfully, download is complete */
    data->req.download_done = TRUE;
    if(blen) {
      infof(data, "Leftovers after chunking: %zu bytes", blen);
    }
  }
  else if((type & CLIENTWRITE_EOS) && !data->req.no_body) {
    failf(data, "transfer closed with outstanding read data remaining");
    return CURLE_PARTIAL_FILE;
  }

  return CURLE_OK;
}